

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_syntax_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  undefined1 *puVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  size_t __n;
  int iVar8;
  char *pcVar9;
  void **ppvVar10;
  long lVar11;
  char syntax [200];
  char *local_120;
  char local_113;
  undefined1 local_112;
  undefined1 local_111;
  char *local_110;
  size_t local_108;
  char *local_100;
  char local_f8 [200];
  
  pcVar9 = " [-%c";
  pcVar6 = " -%c";
  local_100 = suffix;
  for (ppvVar10 = argtable;
      (pbVar3 = (byte *)*ppvVar10, pbVar3 != (byte *)0x0 && ((*pbVar3 & 1) == 0));
      ppvVar10 = ppvVar10 + 1) {
    if ((0 < *(int *)(pbVar3 + 0x28)) &&
       ((char)((*pbVar3 & 2) >> 1) == '\0' && *(char **)(pbVar3 + 8) != (char *)0x0)) {
      arg_dstr_catf(ds,pcVar6,(ulong)(uint)(int)**(char **)(pbVar3 + 8));
      pcVar6 = "%c";
      pcVar9 = "[%c";
    }
  }
  pcVar6 = "";
  for (ppvVar10 = argtable;
      (pbVar3 = (byte *)*ppvVar10, pbVar3 != (byte *)0x0 && ((*pbVar3 & 1) == 0));
      ppvVar10 = ppvVar10 + 1) {
    if ((*(int *)(pbVar3 + 0x28) < 1) &&
       ((char)((*pbVar3 & 2) >> 1) == '\0' && *(char **)(pbVar3 + 8) != (char *)0x0)) {
      arg_dstr_catf(ds,pcVar9,(ulong)(uint)(int)**(char **)(pbVar3 + 8));
      pcVar9 = "%c";
      pcVar6 = "]";
    }
  }
  lVar11 = 0;
  arg_dstr_catf(ds,"%s",pcVar6);
  do {
    pbVar3 = (byte *)argtable[lVar11];
    if ((pbVar3 == (byte *)0x0) || ((*pbVar3 & 1) != 0)) {
      if (local_100 != (char *)0x0) {
        arg_dstr_cat(ds,local_100);
      }
      return;
    }
    memset(local_f8,0,200);
    puVar4 = *(undefined1 **)(pbVar3 + 8);
    bVar1 = *pbVar3;
    if (puVar4 == (undefined1 *)0x0 || (bVar1 & 2) != 0) {
      pcVar6 = *(char **)(pbVar3 + 0x10);
      pcVar9 = *(char **)(pbVar3 + 0x18);
      local_108 = 199;
      local_120 = local_f8;
      if (puVar4 == (undefined1 *)0x0) {
        if (pcVar6 == (char *)0x0) {
          if (pcVar9 != (char *)0x0) {
            if ((bVar1 & 4) != 0) {
              arg_cat(&local_120,"[",&local_108);
              arg_cat(&local_120,pcVar9,&local_108);
              goto LAB_00108eef;
            }
            goto LAB_00108ef9;
          }
        }
        else {
          local_110 = pcVar9;
          arg_cat(&local_120,"--",&local_108);
          sVar7 = strcspn(pcVar6,",");
          __n = local_108;
          if (sVar7 < local_108) {
            __n = sVar7;
          }
          strncat(local_120,pcVar6,__n);
          if (local_110 != (char *)0x0) {
            arg_cat(&local_120,"=",&local_108);
            pcVar9 = local_110;
            if ((bVar1 & 4) != 0) {
              arg_cat(&local_120,"[",&local_108);
              arg_cat(&local_120,local_110,&local_108);
LAB_00108eef:
              pcVar9 = "]";
            }
LAB_00108ef9:
            arg_cat(&local_120,pcVar9,&local_108);
          }
        }
      }
      else {
        local_113 = '-';
        local_112 = *puVar4;
        local_111 = 0;
        local_110 = pcVar9;
        arg_cat(&local_120,&local_113,&local_108);
        if (local_110 != (char *)0x0) {
          arg_cat(&local_120," ",&local_108);
          pcVar9 = local_110;
          if ((bVar1 & 4) != 0) {
            arg_cat(&local_120,"[",&local_108);
            arg_cat(&local_120,local_110,&local_108);
            pcVar9 = "]";
          }
          goto LAB_00108ef9;
        }
      }
      if (local_f8[0] != '\0') {
        iVar8 = 0;
        while( true ) {
          iVar2 = *(int *)((long)argtable[lVar11] + 0x28);
          if (iVar2 <= iVar8) break;
          arg_dstr_cat(ds," ");
          arg_dstr_cat(ds,local_f8);
          iVar8 = iVar8 + 1;
        }
        iVar8 = *(int *)((long)argtable[lVar11] + 0x2c);
        iVar5 = iVar8 - iVar2;
        if (iVar8 != iVar2) {
          pcVar6 = "]";
          if (iVar5 != 1) {
            if (iVar5 == 2) {
              arg_dstr_cat(ds," [");
              arg_dstr_cat(ds,local_f8);
              pcVar6 = "]";
              arg_dstr_cat(ds,"]");
            }
            else {
              pcVar6 = "]...";
            }
          }
          arg_dstr_cat(ds," [");
          arg_dstr_cat(ds,local_f8);
          arg_dstr_cat(ds,pcVar6);
        }
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void arg_print_syntax_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print GNU style [OPTION] string */
    arg_print_gnuswitch_ds(ds, table);

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        /* skip short options without arg values (they were printed by arg_print_gnu_switch) */
        if (table[tabindex]->shortopts && !(table[tabindex]->flag & ARG_HASVALUE))
            continue;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_option(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE);

        if (strlen(syntax) > 0) {
            /* print mandatory instances of this option */
            for (i = 0; i < table[tabindex]->mincount; i++) {
                arg_dstr_cat(ds, " ");
                arg_dstr_cat(ds, syntax);
            }

            /* print optional instances enclosed in "[..]" */
            switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
                case 0:
                    break;
                case 1:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                case 2:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                default:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]...");
                    break;
            }
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}